

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_owner(parser *p)

{
  uint uVar1;
  void *pvVar2;
  char *name_00;
  char *pcVar3;
  int *piVar4;
  player_race *ppVar5;
  int local_44;
  owner *o;
  char *name;
  char *race;
  uint maxcost;
  store *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  uVar1 = parser_getuint(p,"purse");
  name_00 = parser_getsym(p,"race");
  pcVar3 = parser_getstr(p,"name");
  pcVar3 = string_make(pcVar3);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    piVar4 = (int *)mem_zalloc(0x28);
    if (*(long *)((long)pvVar2 + 8) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = **(int **)((long)pvVar2 + 8) + 1;
    }
    *piVar4 = local_44;
    *(undefined8 *)(piVar4 + 2) = *(undefined8 *)((long)pvVar2 + 8);
    *(char **)(piVar4 + 4) = pcVar3;
    ppVar5 = player_race_from_name(name_00);
    *(player_race **)(piVar4 + 6) = ppVar5;
    piVar4[8] = uVar1;
    *(int **)((long)pvVar2 + 8) = piVar4;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_owner(struct parser *p) {
	struct store *s = parser_priv(p);
	unsigned int maxcost = parser_getuint(p, "purse");
	const char *race = parser_getsym(p, "race");
	char *name = string_make(parser_getstr(p, "name"));
	struct owner *o;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	o = mem_zalloc(sizeof *o);
	o->oidx = (s->owners ? s->owners->oidx + 1 : 0);
	o->next = s->owners;
	o->name = name;
	o->race = player_race_from_name(race);
	o->max_cost = maxcost;
	s->owners = o;
	return PARSE_ERROR_NONE;
}